

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::QueryStringCase::iterate(QueryStringCase *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  Library *pLVar2;
  undefined4 extraout_var;
  allocator<char> local_199;
  undefined1 local_198 [384];
  
  pLVar2 = EglTestContext::getLibrary((this->super_InfoCase).super_TestCase.m_eglTestCtx);
  iVar1 = (*pLVar2->_vptr_Library[0x2a])
                    (pLVar2,(this->super_InfoCase).m_display,(ulong)(uint)this->m_query);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglQueryString() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglInfoTests.cpp"
                   ,0x7f);
  local_198._0_8_ =
       ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,(char *)CONCAT44(extraout_var,iVar1));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  tcu::TestContext::setTestResult
            ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,(char *)CONCAT44(extraout_var,iVar1),&local_199);
  validateString(this,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		const char*		result	= egl.queryString(m_display, m_query);
		EGLU_CHECK_MSG(egl, "eglQueryString() failed");

		m_testCtx.getLog() << tcu::TestLog::Message << result << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		validateString(result);

		return STOP;
	}